

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Gia_Man_t * Gia_ManEquivReduce(Gia_Man_t *p,int fUseAll,int fDualOut,int fSkipPhase,int fVerbose)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  void *__s;
  Gia_Rpr_t *pGVar5;
  int *piVar6;
  Gia_Man_t *pGVar7;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) && (p->pSibls != (int *)0x0)) {
    iVar1 = p->nObjs;
    sVar8 = (long)iVar1 * 4;
    __s = malloc(sVar8);
    memset(__s,0xff,sVar8);
    pGVar5 = (Gia_Rpr_t *)calloc((long)iVar1,4);
    p->pReprs = pGVar5;
    uVar4 = p->nObjs;
    if (0 < (int)uVar4) {
      lVar16 = 0;
      do {
        p->pReprs[lVar16] = (Gia_Rpr_t)((uint)p->pReprs[lVar16] | 0xfffffff);
        lVar16 = lVar16 + 1;
        uVar4 = p->nObjs;
      } while (lVar16 < (int)uVar4);
    }
    if (0 < (int)uVar4) {
      piVar6 = p->pSibls;
      uVar13 = 0;
      do {
        lVar16 = (long)piVar6[uVar13];
        if (0 < lVar16) {
          if (*(int *)((long)__s + lVar16 * 4) == -1) {
            *(int *)((long)__s + lVar16 * 4) = piVar6[uVar13];
          }
          *(undefined4 *)((long)__s + uVar13 * 4) = *(undefined4 *)((long)__s + lVar16 * 4);
        }
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
    }
    if (0 < p->nObjs) {
      lVar16 = 0;
      do {
        if (0 < p->pSibls[lVar16]) {
          uVar4 = *(uint *)((long)__s + lVar16 * 4);
          if (lVar16 <= (int)uVar4 && (long)(int)uVar4 != 0xfffffff) {
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          p->pReprs[lVar16] = (Gia_Rpr_t)((uint)p->pReprs[lVar16] & 0xf0000000 | uVar4 & 0xfffffff);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < p->nObjs);
    }
    if (p->pNexts != (int *)0x0) {
      free(p->pNexts);
      p->pNexts = (int *)0x0;
    }
    piVar6 = Gia_ManDeriveNexts(p);
    p->pNexts = piVar6;
    if (__s != (void *)0x0) {
      free(__s);
    }
  }
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    pcVar14 = "Gia_ManEquivReduce(): Equivalence classes are not available.\n";
  }
  else {
    if ((fDualOut == 0) || ((p->vCos->nSize - p->nRegs & 1U) == 0)) {
      uVar4 = p->nObjs;
      if ((int)uVar4 < 1) {
        uVar13 = 0;
      }
      else {
        uVar12 = 0;
        do {
          uVar13 = uVar12;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          uVar15 = (uint)p->pReprs[uVar12] & 0xfffffff;
          if (uVar15 != 0xfffffff) {
            if ((int)uVar4 <= (int)uVar15) goto LAB_001fd683;
            if (uVar15 != 0xfffffff) break;
          }
          uVar12 = uVar12 + 1;
          uVar13 = (ulong)uVar4;
        } while (uVar4 != uVar12);
      }
      if ((uint)uVar13 == uVar4) {
        pGVar7 = Gia_ManDup(p);
        return pGVar7;
      }
      if (fSkipPhase == 0) {
        Gia_ManSetPhase(p);
      }
      if (fDualOut != 0) {
        Gia_ManEquivSetColors(p,fVerbose);
      }
      pGVar7 = Gia_ManStart(p->nObjs);
      pcVar14 = p->pName;
      if (pcVar14 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar14);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar14);
      }
      pGVar7->pName = pcVar9;
      pcVar14 = p->pSpec;
      if (pcVar14 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        sVar8 = strlen(pcVar14);
        pcVar9 = (char *)malloc(sVar8 + 1);
        strcpy(pcVar9,pcVar14);
      }
      pGVar7->pSpec = pcVar9;
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      pVVar10 = p->vCis;
      if (0 < pVVar10->nSize) {
        lVar16 = 0;
        do {
          iVar1 = pVVar10->pArray[lVar16];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fd683;
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          pGVar11 = Gia_ManAppendObj(pGVar7);
          uVar13 = *(ulong *)pGVar11;
          *(ulong *)pGVar11 = uVar13 | 0x9fffffff;
          *(ulong *)pGVar11 =
               uVar13 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(pGVar7->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar3 = pGVar7->pObjs;
          if ((pGVar11 < pGVar3) || (pGVar3 + pGVar7->nObjs <= pGVar11)) {
LAB_001fd6a2:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(pGVar7->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = pGVar7->pObjs;
          if ((pGVar11 < pGVar3) || (pGVar3 + pGVar7->nObjs <= pGVar11)) goto LAB_001fd6a2;
          pGVar2[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * 0x55555556;
          lVar16 = lVar16 + 1;
          pVVar10 = p->vCis;
        } while (lVar16 < pVVar10->nSize);
      }
      Gia_ManHashAlloc(pGVar7);
      pVVar10 = p->vCos;
      if (0 < pVVar10->nSize) {
        lVar16 = 0;
        do {
          iVar1 = pVVar10->pArray[lVar16];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fd683;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar1;
          Gia_ManEquivReduce_rec
                    (pGVar7,p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),fUseAll,
                     fDualOut);
          lVar16 = lVar16 + 1;
          pVVar10 = p->vCos;
        } while (lVar16 < pVVar10->nSize);
      }
      pVVar10 = p->vCos;
      if (0 < pVVar10->nSize) {
        lVar16 = 0;
        do {
          iVar1 = pVVar10->pArray[lVar16];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001fd683:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar1;
          if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar4 = Gia_ManAppendCo(pGVar7,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                         pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].
                                         Value);
          pGVar2->Value = uVar4;
          lVar16 = lVar16 + 1;
          pVVar10 = p->vCos;
        } while (lVar16 < pVVar10->nSize);
      }
      Gia_ManHashStop(pGVar7);
      Gia_ManSetRegNum(pGVar7,p->nRegs);
      return pGVar7;
    }
    pcVar14 = "Gia_ManEquivReduce(): Dual-output miter should have even number of POs.\n";
  }
  Abc_Print(1,pcVar14);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManEquivReduce( Gia_Man_t * p, int fUseAll, int fDualOut, int fSkipPhase, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    if ( !p->pReprs && p->pSibls )
    {
        int * pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
        p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( p, i, GIA_VOID );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
            {
                if ( pMap[p->pSibls[i]] == -1 )
                    pMap[p->pSibls[i]] = p->pSibls[i];
                pMap[i] = pMap[p->pSibls[i]];
            }
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
                Gia_ObjSetRepr( p, i, pMap[i] );
        //printf( "Created equivalence classes.\n" );
        ABC_FREE( p->pNexts );
        p->pNexts = Gia_ManDeriveNexts( p );
        ABC_FREE( pMap );
    }
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }
    // check if there are any equivalences defined
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    if ( i == Gia_ManObjNum(p) )
    {
//        Abc_Print( 1, "Gia_ManEquivReduce(): There are no equivalences to reduce.\n" );
//        return NULL;
        return Gia_ManDup( p );
    }
/*
    if ( !Gia_ManCheckTopoOrder( p ) )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): AIG is not in a correct topological order.\n" );
        return NULL;
    }
*/
    if ( !fSkipPhase )
        Gia_ManSetPhase( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, fVerbose );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivReduce_rec( pNew, p, Gia_ObjFanin0(pObj), fUseAll, fDualOut );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}